

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VecAttrListImpl.cpp
# Opt level: O1

XMLCh * __thiscall xercesc_4_0::VecAttrListImpl::getValue(VecAttrListImpl *this,char *name)

{
  XMLCh XVar1;
  XMLCh XVar2;
  XMLCh *pXVar3;
  XMLAttr *this_00;
  XMLCh *pXVar4;
  XMLCh *pXVar5;
  XMLSize_t getAt;
  bool bVar6;
  ArrayJanitor<char16_t> janName;
  ArrayJanitor<char16_t> AStack_38;
  
  pXVar3 = XMLString::transcode(name,XMLPlatformUtils::fgMemoryManager);
  ArrayJanitor<char16_t>::ArrayJanitor(&AStack_38,pXVar3,XMLPlatformUtils::fgMemoryManager);
  if (this->fCount != 0) {
    getAt = 0;
    do {
      this_00 = BaseRefVectorOf<xercesc_4_0::XMLAttr>::elementAt
                          (&this->fVector->super_BaseRefVectorOf<xercesc_4_0::XMLAttr>,getAt);
      pXVar4 = XMLAttr::getQName(this_00);
      bVar6 = true;
      if (pXVar4 != pXVar3) {
        pXVar5 = pXVar3;
        if (pXVar4 == (XMLCh *)0x0 || pXVar3 == (XMLCh *)0x0) {
          if (pXVar4 == (XMLCh *)0x0) {
            if (pXVar3 != (XMLCh *)0x0) goto LAB_002bf8b2;
          }
          else {
            bVar6 = *pXVar4 == L'\0';
            if ((pXVar3 != (XMLCh *)0x0) && (*pXVar4 == L'\0')) {
LAB_002bf8b2:
              bVar6 = *pXVar5 == L'\0';
            }
          }
        }
        else {
          do {
            XVar1 = *pXVar4;
            if (XVar1 == L'\0') goto LAB_002bf8b2;
            pXVar4 = pXVar4 + 1;
            XVar2 = *pXVar5;
            pXVar5 = pXVar5 + 1;
          } while (XVar1 == XVar2);
          bVar6 = false;
        }
      }
      if (bVar6) {
        pXVar3 = this_00->fValue;
        goto LAB_002bf8d5;
      }
      getAt = getAt + 1;
    } while (getAt < this->fCount);
  }
  pXVar3 = (XMLCh *)0x0;
LAB_002bf8d5:
  ArrayJanitor<char16_t>::~ArrayJanitor(&AStack_38);
  return pXVar3;
}

Assistant:

const XMLCh* VecAttrListImpl::getValue(const char* const name) const
{
    // Temporarily transcode the name for lookup
    XMLCh* wideName = XMLString::transcode(name, XMLPlatformUtils::fgMemoryManager);
    ArrayJanitor<XMLCh> janName(wideName, XMLPlatformUtils::fgMemoryManager);

    //
    //  Search the vector for the attribute with the given name and return
    //  its type.
    //
    for (XMLSize_t index = 0; index < fCount; index++)
    {
        const XMLAttr* curElem = fVector->elementAt(index);

        if (XMLString::equals(curElem->getQName(), wideName))
            return curElem->getValue();
    }
    return 0;
}